

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetUInt64
          (OptionInterpreter *this,int number,uint64 value,Type type,UnknownFieldSet *unknown_fields
          )

{
  LogMessage *this_00;
  int in_ECX;
  undefined8 in_RDI;
  LogMessage *unaff_retaddr;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  LogMessage *in_stack_ffffffffffffff70;
  LogMessage *in_stack_ffffffffffffff80;
  UnknownFieldSet *in_stack_ffffffffffffff90;
  undefined1 local_60 [92];
  int value_00;
  
  value_00 = (int)((ulong)in_RDI >> 0x20);
  if (in_ECX == 4) {
    UnknownFieldSet::AddVarint(in_stack_ffffffffffffff90,4,(uint64)in_stack_ffffffffffffff80);
  }
  else if (in_ECX == 6) {
    UnknownFieldSet::AddFixed64(in_stack_ffffffffffffff90,6,(uint64)in_stack_ffffffffffffff80);
  }
  else {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff80,(LogLevel_conflict)((ulong)local_60 >> 0x20),
               (char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff70,
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    this_00 = internal::LogMessage::operator<<(unaff_retaddr,value_00);
    internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    internal::LogMessage::~LogMessage((LogMessage *)0x4b4dc5);
  }
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::SetUInt64(
    int number, uint64 value, FieldDescriptor::Type type,
    UnknownFieldSet* unknown_fields) {
  switch (type) {
    case FieldDescriptor::TYPE_UINT64:
      unknown_fields->AddVarint(number, value);
      break;

    case FieldDescriptor::TYPE_FIXED64:
      unknown_fields->AddFixed64(number, value);
      break;

    default:
      GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_UINT64: " << type;
      break;
  }
}